

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckDeclarationOrder.cxx
# Opt level: O2

bool __thiscall
kws::Parser::CheckDeclarationOrder
          (Parser *this,size_t posPublic,size_t posProtected,size_t posPrivate)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t publicFirst;
  size_t privateFirst;
  size_t protectedFirst;
  Error error;
  size_t privateLast;
  size_t protectedLast;
  size_t publicLast;
  
  this->m_TestsDone[8] = true;
  pcVar2 = (char *)operator_new__(0xff);
  builtin_strncpy(pcVar2,"Declaration order should match ",0x20);
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 8));
  if ((((posProtected < posPublic && posPrivate < posProtected) ||
       (posPublic < posProtected && posProtected < posPrivate)) ||
      (posPrivate < posPublic && posProtected < posPrivate)) ||
     (posPublic < posPrivate && posProtected < posPrivate)) {
    std::__cxx11::string::append((char *)(this->m_TestsDescription + 8));
  }
  operator_delete__(pcVar2);
  sVar3 = 0;
  while( true ) {
    FindPublicArea(this,&publicFirst,&publicLast,sVar3);
    sVar3 = FindEndOfClass(this,publicFirst);
    sVar4 = FindOpeningChar(this,'}','{',sVar3,true);
    if (((publicFirst == 0xffffffffffffffff) || (publicFirst == 99999999)) ||
       (sVar4 <= publicFirst && publicFirst <= sVar3)) break;
    sVar3 = publicFirst + 1;
  }
  sVar3 = 0;
  while( true ) {
    FindProtectedArea(this,&protectedFirst,&protectedLast,sVar3);
    sVar3 = FindEndOfClass(this,protectedFirst);
    sVar3 = FindOpeningChar(this,'}','{',sVar3,true);
    if (((protectedFirst == 0xffffffffffffffff) || (protectedFirst == 99999999)) || (sVar3 == sVar4)
       ) break;
    sVar3 = protectedFirst + 1;
  }
  sVar3 = 0;
  while( true ) {
    FindPrivateArea(this,&privateFirst,&privateLast,sVar3);
    sVar3 = FindEndOfClass(this,privateFirst);
    sVar3 = FindOpeningChar(this,'}','{',sVar3,true);
    if (((privateFirst == 0xffffffffffffffff) || (privateFirst == 99999999)) || (sVar3 == sVar4))
    break;
    sVar3 = privateFirst + 1;
  }
  if (publicFirst < protectedFirst &&
      ((publicFirst != 99999999 && protectedFirst != 99999999) && posProtected < posPublic)) {
    error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
    error.description._M_string_length = 0;
    error.description.field_2._M_local_buf[0] = '\0';
    error.line = GetLineNumber(this,publicFirst,true);
    error.line2 = GetLineNumber(this,publicFirst,true);
    error.number = 8;
    std::__cxx11::string::assign((char *)&error.description);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&error);
  }
  else {
    if ((publicFirst <= protectedFirst || posProtected <= posPublic) ||
        (protectedFirst == 99999999 || publicFirst == 99999999)) {
      bVar1 = 0;
      goto LAB_00141e51;
    }
    error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
    error.description._M_string_length = 0;
    error.description.field_2._M_local_buf[0] = '\0';
    error.line = GetLineNumber(this,protectedFirst,true);
    error.line2 = GetLineNumber(this,protectedFirst,true);
    error.number = 8;
    std::__cxx11::string::assign((char *)&error.description);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&error);
  }
  std::__cxx11::string::~string((string *)&error.description);
  bVar1 = 1;
LAB_00141e51:
  if (privateFirst < protectedFirst &&
      ((privateFirst != 99999999 && protectedFirst != 99999999) && posProtected < posPrivate)) {
    error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
    error.description._M_string_length = 0;
    error.description.field_2._M_local_buf[0] = '\0';
    error.line = GetLineNumber(this,privateFirst,true);
    error.line2 = GetLineNumber(this,privateFirst,true);
    error.number = 8;
    std::__cxx11::string::assign((char *)&error.description);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&error);
    std::__cxx11::string::~string((string *)&error.description);
    bVar1 = 1;
  }
  if (publicFirst < privateFirst &&
      ((publicFirst != 99999999 && privateFirst != 99999999) && posPrivate < posPublic)) {
    error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
    error.description._M_string_length = 0;
    error.description.field_2._M_local_buf[0] = '\0';
    error.line = GetLineNumber(this,publicFirst,true);
    error.line2 = GetLineNumber(this,publicFirst,true);
    error.number = 8;
    std::__cxx11::string::assign((char *)&error.description);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&error);
    std::__cxx11::string::~string((string *)&error.description);
    bVar1 = 1;
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool Parser::CheckDeclarationOrder(size_t posPublic, size_t posProtected, size_t posPrivate)
{
  m_TestsDone[DECL_ORDER] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Declaration order should match ");
  m_TestsDescription[DECL_ORDER] = val;

  if(posPublic>posProtected && posProtected>posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Private/Protected/Public";
    }
  else if(posPublic<posProtected && posProtected<posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Public/Protected/Private";
    }
  else if(posPublic>posPrivate && posProtected<posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Protected/Private/Public";
    } 
  else if(posPublic<posPrivate && posProtected<posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Protected/Public/Private";
    }

  delete [] val;

  size_t publicFirst;
  size_t publicLast;
  this->FindPublicArea(publicFirst,publicLast);
  
  size_t class_end = this->FindEndOfClass(publicFirst);
  size_t class_beg = this->FindOpeningChar('}','{',class_end,true);

  // Find the first public declaration
  while(publicFirst!=std::string::npos && publicFirst!=MAX_CHAR && (publicFirst<class_beg || publicFirst>class_end))
    {
    this->FindPublicArea(publicFirst,publicLast,publicFirst+1);
    class_end = this->FindEndOfClass(publicFirst);
    class_beg = this->FindOpeningChar('}','{',class_end,true);
    }
  
  // Currently checking only one class per file (do a loop in the future)
  size_t currentclass = class_beg;

  size_t protectedFirst;
  size_t protectedLast;
  this->FindProtectedArea(protectedFirst,protectedLast);

  class_end = this->FindEndOfClass(protectedFirst);
  class_beg = this->FindOpeningChar('}','{',class_end,true);
  while(protectedFirst!=std::string::npos && protectedFirst!=MAX_CHAR &&class_beg != currentclass)
    {
    this->FindProtectedArea(protectedFirst,protectedLast,protectedFirst+1);
    class_end = this->FindEndOfClass(protectedFirst);
    class_beg = this->FindOpeningChar('}','{',class_end,true);
    }
  
  size_t privateFirst;
  size_t privateLast;
  this->FindPrivateArea(privateFirst,privateLast);

  class_end = this->FindEndOfClass(privateFirst);
  class_beg = this->FindOpeningChar('}','{',class_end,true);

  while(privateFirst!=std::string::npos && privateFirst!=MAX_CHAR && class_beg != currentclass)
    {
    this->FindPrivateArea(privateFirst,privateLast,privateFirst+1);    
    class_end = this->FindEndOfClass(privateFirst);
    class_beg = this->FindOpeningChar('}','{',class_end,true);
    }
 
  bool hasError = false;

  // public v.s protected
  if( (posPublic > posProtected)
      && (protectedFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (protectedFirst > publicFirst)
    ) 
    {
    Error error;
    error.line =  this->GetLineNumber(publicFirst,true);
    error.line2 = this->GetLineNumber(publicFirst,true);
    error.number = DECL_ORDER;
    error.description = "Public defined before Protected";
    m_ErrorList.push_back(error);
    hasError = true;
    }
  else if(
     (posPublic < posProtected)
      && (protectedFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (protectedFirst < publicFirst)
      )
     {
     Error error;
     error.line =  this->GetLineNumber(protectedFirst,true);
     error.line2 = this->GetLineNumber(protectedFirst,true);
     error.number = DECL_ORDER;
     error.description = "Protected defined before Public";
     m_ErrorList.push_back(error);
     hasError = true;
     }

  // protected v.s. private
  if( (posPrivate > posProtected)
      && (protectedFirst != MAX_CHAR)
      && (privateFirst != MAX_CHAR)
      && (protectedFirst > privateFirst)
    ) 
    {
    Error error;
    error.line =  this->GetLineNumber(privateFirst,true);
    error.line2 = this->GetLineNumber(privateFirst,true);
    error.number = DECL_ORDER;
    error.description = "Private defined before Protected";
    m_ErrorList.push_back(error);
    hasError = true;
    }
  else if(
     (posPrivate > posProtected)
      && (protectedFirst != MAX_CHAR)
      && (privateFirst != MAX_CHAR)
      && (protectedFirst > privateFirst)
      )
     {
     Error error;
     error.line =  this->GetLineNumber(protectedFirst,true);
     error.line2 = this->GetLineNumber(protectedFirst,true);
     error.number = DECL_ORDER;
     error.description = "Protected defined before Private";
     m_ErrorList.push_back(error);
     hasError = true;
     }

  // Public v.s. Private
  if( (posPublic > posPrivate)
      && (privateFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (privateFirst > publicFirst)
    ) 
    {
    Error error;
    error.line =  this->GetLineNumber(publicFirst,true);
    error.line2 = this->GetLineNumber(publicFirst,true);
    error.number = DECL_ORDER;
    error.description = "Public defined before Private";
    m_ErrorList.push_back(error);
    hasError = true;
    }
  else if(
     (posPublic > posPrivate)
      && (privateFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (privateFirst > publicFirst)
      )
     {
     Error error;
     error.line =  this->GetLineNumber(privateFirst,true);
     error.line2 = this->GetLineNumber(privateFirst,true);
     error.number = DECL_ORDER;
     error.description = "Private defined before Public";
     m_ErrorList.push_back(error);
     hasError = true;
     }
     
  return !hasError;
}